

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void __thiscall
option::PrintUsageImplementation::LinePartIterator::restartRow(LinePartIterator *this)

{
  LinePartIterator *this_local;
  
  this->ptr = this->rowstart;
  this->col = -1;
  this->len = 0;
  this->screenlen = 0;
  this->max_line_in_block = 0;
  this->line_in_block = 0;
  this->target_line_in_block = 0;
  this->hit_target_line = true;
  return;
}

Assistant:

void restartRow()
    {
      ptr = rowstart;
      col = -1;
      len = 0;
      screenlen = 0;
      max_line_in_block = 0;
      line_in_block = 0;
      target_line_in_block = 0;
      hit_target_line = true;
    }